

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

numeric * cs_impl::runtime_cs_ext::argument_count(numeric *__return_storage_ptr__,var *func)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  object_method *poVar3;
  undefined4 extraout_var_01;
  undefined *puVar4;
  callable *pcVar5;
  type_info *ptVar6;
  cni *pcVar7;
  undefined4 extraout_var_02;
  function *pfVar8;
  long lVar9;
  long *plVar10;
  uint *local_38;
  long local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if (func->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if (pcVar1 == "N2cs13object_methodE") {
LAB_001a352f:
    poVar3 = any::const_val<cs::object_method>(func);
    pcVar5 = any::const_val<cs::callable>(&poVar3->callable);
    ptVar6 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target_type(&pcVar5->mFunc);
    pcVar1 = *(char **)(ptVar6 + 8);
    if (pcVar1 == "N2cs8functionE") {
LAB_001a3580:
      pfVar8 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs::function>(&pcVar5->mFunc);
      lVar9 = (long)(pfVar8->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pfVar8->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    else {
      if (*pcVar1 != '*') {
        iVar2 = strcmp(pcVar1,"N2cs8functionE");
        if (iVar2 == 0) goto LAB_001a3580;
      }
      pcVar7 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs_impl::cni>(&pcVar5->mFunc);
      iVar2 = (*pcVar7->mCni->_vptr_cni_holder_base[2])();
      lVar9 = CONCAT44(extraout_var_01,iVar2);
    }
    lVar9 = lVar9 + -1;
    goto LAB_001a362b;
  }
  if (*pcVar1 != '*') {
    iVar2 = strcmp(pcVar1,"N2cs13object_methodE");
    if (iVar2 == 0) goto LAB_001a352f;
  }
  if (func->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar2);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if (pcVar1 != "N2cs8callableE") {
    if (*pcVar1 == '*') {
LAB_001a363f:
      plVar10 = (long *)__cxa_allocate_exception(0x20);
      local_38 = &local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not a function.","");
      *plVar10 = (long)(plVar10 + 2);
      if (local_38 == &local_28) {
        *(uint *)(plVar10 + 2) = local_28;
        *(undefined4 *)((long)plVar10 + 0x14) = uStack_24;
        *(undefined4 *)(plVar10 + 3) = uStack_20;
        *(undefined4 *)((long)plVar10 + 0x1c) = uStack_1c;
      }
      else {
        *plVar10 = (long)local_38;
        plVar10[2] = CONCAT44(uStack_24,local_28);
      }
      plVar10[1] = local_30;
      local_30 = 0;
      local_28 = local_28 & 0xffffff00;
      local_38 = &local_28;
      __cxa_throw(plVar10,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    iVar2 = strcmp(pcVar1,"N2cs8callableE");
    if (iVar2 != 0) goto LAB_001a363f;
  }
  pcVar5 = any::const_val<cs::callable>(func);
  ptVar6 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           ::target_type(&pcVar5->mFunc);
  pcVar1 = *(char **)(ptVar6 + 8);
  if (pcVar1 == "N2cs8functionE") {
LAB_001a3614:
    pfVar8 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target<cs::function>(&pcVar5->mFunc);
    lVar9 = (long)(pfVar8->mArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pfVar8->mArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  else {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"N2cs8functionE");
      if (iVar2 == 0) goto LAB_001a3614;
    }
    pcVar7 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target<cs_impl::cni>(&pcVar5->mFunc);
    iVar2 = (*pcVar7->mCni->_vptr_cni_holder_base[2])();
    lVar9 = CONCAT44(extraout_var_02,iVar2);
  }
LAB_001a362b:
  __return_storage_ptr__->type = true;
  (__return_storage_ptr__->data)._int = lVar9;
  return __return_storage_ptr__;
}

Assistant:

numeric argument_count(const var &func)
		{
			if (func.type() == typeid(object_method)) {
				const callable::function_type &target = func.const_val<object_method>().callable.const_val<callable>().get_raw_data();
				if (target.target_type() == typeid(function))
					return target.target<function>()->argument_count() - 1;
				else
					return target.target<cni>()->argument_count() - 1;
			}
			else if (func.type() == typeid(callable)) {
				const callable::function_type &target = func.const_val<callable>().get_raw_data();
				if (target.target_type() == typeid(function))
					return target.target<function>()->argument_count();
				else
					return target.target<cni>()->argument_count();
			}
			else
				throw lang_error("Not a function.");
		}